

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O0

int Mecab_refresh(Mecab *m)

{
  long *in_RDI;
  int i;
  int local_c;
  
  if (*in_RDI != 0) {
    for (local_c = 0; local_c < (int)in_RDI[1]; local_c = local_c + 1) {
      free(*(void **)(*in_RDI + (long)local_c * 8));
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 1) = 0;
  }
  return 1;
}

Assistant:

BOOL Mecab_refresh(Mecab *m)
{
   int i;

   if(m->feature != NULL) {
      for(i = 0; i < m->size; i++)
         free(m->feature[i]);
      free(m->feature);
      m->feature = NULL;
      m->size = 0;
   }

   return TRUE;
}